

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionTest.cpp
# Opt level: O0

void __thiscall
AssertionTest_assertGtHandlerShouldNotBeCalled_Test::
AssertionTest_assertGtHandlerShouldNotBeCalled_Test
          (AssertionTest_assertGtHandlerShouldNotBeCalled_Test *this)

{
  AssertionTest_assertGtHandlerShouldNotBeCalled_Test *this_local;
  
  AssertionTest::AssertionTest(&this->super_AssertionTest);
  (this->super_AssertionTest).super_Test._vptr_Test =
       (_func_int **)&PTR__AssertionTest_assertGtHandlerShouldNotBeCalled_Test_001d2228;
  return;
}

Assistant:

TEST_F(AssertionTest, assertGtHandlerShouldNotBeCalled)
{
    std::int32_t a = 2;
    std::int32_t b = 1;
    CPP_ASSERT_GT(a, b);
    EXPECT_EQ(0, assertionHandlerCounter_);

    SET_EXPECTED_MSG(a, b);
    CPP_ASSERT_GT(a, b, EXPECTED_TEST_MSG(a,b));
    EXPECT_EQ(0, assertionHandlerCounter_);
}